

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall Rnase::Rnase(Rnase *this,int footprint,double speed)

{
  allocator local_41;
  double local_40;
  string local_38;
  
  local_40 = speed;
  std::__cxx11::string::string((string *)&local_38,"__rnase",&local_41);
  MobileElement::MobileElement(&this->super_MobileElement,&local_38,footprint,local_40);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_MobileElement)._vptr_MobileElement = (_func_int **)&PTR__MobileElement_0019d6d0;
  return;
}

Assistant:

Rnase::Rnase(int footprint, double speed)
    : MobileElement("__rnase", footprint, speed) {}